

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::InsertOrLookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,MapValueRef *val)

{
  MapValueRef *pMVar1;
  bool bVar2;
  undefined1 uVar3;
  uint32 uVar4;
  Descriptor *this_00;
  FieldDescriptor *pFVar5;
  _func_void_FieldDescriptor_ptr *local_70;
  FieldDescriptor *local_68;
  string local_60;
  MapValueRef *local_40;
  MapKey *local_38;
  
  local_40 = val;
  local_38 = key;
  bVar2 = anon_unknown_0::IsMapFieldInApi(field);
  if (!bVar2) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"InsertOrLookupMapValue\"","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"value","");
  pFVar5 = Descriptor::FindFieldByName(this_00,&local_60);
  if (*(once_flag **)(pFVar5 + 0x30) != (once_flag *)0x0) {
    local_70 = FieldDescriptor::TypeOnceInit;
    local_68 = pFVar5;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar5 + 0x30),&local_70,&local_68);
  }
  pMVar1 = local_40;
  local_40->type_ =
       *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar5 + 0x38) * 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  uVar3 = (**(code **)(*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                (ulong)uVar4) + 0x18))
                    ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4,local_38,
                     pMVar1);
  return (bool)uVar3;
}

Assistant:

bool Reflection::InsertOrLookupMapValue(Message* message,
                                        const FieldDescriptor* field,
                                        const MapKey& key,
                                        MapValueRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), "InsertOrLookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return MutableRaw<MapFieldBase>(message, field)
      ->InsertOrLookupMapValue(key, val);
}